

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_ar.c
# Opt level: O1

void test_write_format_ar(void)

{
  size_t v1;
  archive_entry *entry;
  int iVar1;
  mode_t mVar2;
  archive *paVar3;
  size_t sVar4;
  size_t sVar5;
  time_t tVar6;
  la_ssize_t lVar7;
  la_int64_t lVar8;
  la_int64_t v2;
  char *pcVar9;
  size_t used;
  archive_entry *ae;
  size_t local_40;
  archive_entry *local_38;
  
  paVar3 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                   ,L'+',(uint)(paVar3 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_ar_svr4(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L',',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ar_svr4(a)",paVar3)
  ;
  iVar1 = archive_write_open_memory(paVar3,buff,0x1000,&local_40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'-',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, sizeof(buff), &used)",paVar3);
  local_38 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                   ,L'0',(uint)(local_38 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(local_38,"//");
  entry = local_38;
  sVar4 = strlen(strtab);
  archive_entry_set_size(entry,sVar4);
  iVar1 = archive_write_header(paVar3,local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'3',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar3);
  sVar4 = strlen(strtab);
  sVar5 = archive_write_data(paVar3,strtab,sVar4);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                   ,L'4',(uint)(sVar4 == sVar5),
                   "strlen(strtab) == (size_t)archive_write_data(a, strtab, strlen(strtab))",paVar3)
  ;
  archive_entry_free(local_38);
  local_38 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                   ,L'8',(uint)(local_38 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(local_38,1,0);
  tVar6 = archive_entry_mtime(local_38);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                   ,L':',(uint)(tVar6 == 1),"1 == archive_entry_mtime(ae)",(void *)0x0);
  archive_entry_set_mode(local_38,0x81ed);
  mVar2 = archive_entry_mode(local_38);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                   ,L'<',(uint)(mVar2 == 0x81ed),"(S_IFREG | 0755) == archive_entry_mode(ae)",
                   (void *)0x0);
  archive_entry_copy_pathname(local_38,"abcdefghijklmn.o");
  archive_entry_set_size(local_38,8);
  iVar1 = archive_write_header(paVar3,local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'?',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar3);
  lVar7 = archive_write_data(paVar3,"87654321",0xf);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                   ,L'@',(uint)(lVar7 == 8),"8 == archive_write_data(a, \"87654321\", 15)",paVar3);
  archive_entry_free(local_38);
  local_38 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                   ,L'C',(uint)(local_38 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(local_38,"ggghhhjjjrrrttt.o");
  archive_entry_set_filetype(local_38,0x8000);
  archive_entry_set_size(local_38,7);
  iVar1 = archive_write_header(paVar3,local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'G',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar3);
  lVar7 = archive_write_data(paVar3,"7777777",7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'H',7,"7",lVar7,"archive_write_data(a, \"7777777\", 7)",paVar3);
  archive_entry_free(local_38);
  local_38 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                   ,L'L',(uint)(local_38 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(local_38,"/usr/home/xx/iiijjjdddsssppp.o");
  archive_entry_set_mode(local_38,0x81ed);
  archive_entry_set_size(local_38,8);
  iVar1 = archive_write_header(paVar3,local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'P',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar3);
  lVar7 = archive_write_data(paVar3,"88877766",8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'Q',8,"8",lVar7,"archive_write_data(a, \"88877766\", 8)",paVar3);
  archive_entry_free(local_38);
  local_38 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                   ,L'U',(uint)(local_38 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(local_38,"/usr/home/xx/iiijjj/");
  archive_entry_set_size(local_38,8);
  iVar1 = archive_write_header(paVar3,local_38);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                   ,L'X',(uint)(iVar1 != 0),"0 != archive_write_header(a, ae)",paVar3);
  archive_entry_free(local_38);
  local_38 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                   ,L'\\',(uint)(local_38 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(local_38,"gfgh.o");
  archive_entry_set_mode(local_38,0x41ed);
  archive_entry_set_size(local_38,6);
  iVar1 = archive_write_header(paVar3,local_38);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                   ,L'`',(uint)(iVar1 != 0),"0 != archive_write_header(a, ae)",paVar3);
  archive_entry_free(local_38);
  iVar1 = archive_write_close(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'c',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar3);
  lVar8 = archive_filter_bytes(paVar3,-1);
  v2 = archive_filter_bytes(paVar3,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'e',lVar8,"archive_filter_bytes(a, -1)",v2,"archive_filter_bytes(a, 0)",
                      (void *)0x0);
  v1 = local_40;
  lVar8 = archive_filter_bytes(paVar3,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'f',v1,"used",lVar8,"archive_filter_bytes(a, 0)",(void *)0x0);
  iVar1 = archive_write_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'g',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  paVar3 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                   ,L'l',(uint)(paVar3 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'm',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar3);
  iVar1 = archive_read_support_filter_all(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'n',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar3);
  iVar1 = archive_read_open_memory(paVar3,buff,local_40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'o',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff, used)",
                      paVar3);
  iVar1 = archive_read_next_header(paVar3,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'q',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  tVar6 = archive_entry_mtime(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'r',0,"0",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  pcVar9 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
             ,L's',"//","\"//\"",pcVar9,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  lVar8 = archive_entry_size(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L't',0,"0",lVar8,"archive_entry_size(ae)",(void *)0x0);
  iVar1 = archive_read_next_header(paVar3,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'v',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  tVar6 = archive_entry_mtime(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'w',1,"1",tVar6,"archive_entry_mtime(ae)",(void *)0x0);
  pcVar9 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
             ,L'x',"abcdefghijklmn.o","\"abcdefghijklmn.o\"",pcVar9,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  lVar8 = archive_entry_size(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'y',8,"8",lVar8,"archive_entry_size(ae)",(void *)0x0);
  lVar7 = archive_read_data(paVar3,buff2,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'z',8,"8",lVar7,"archive_read_data(a, buff2, 10)",paVar3);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'{',buff2,"buff2","87654321","\"87654321\"",8,"8",(void *)0x0);
  iVar1 = archive_read_next_header(paVar3,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'}',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",
                      (void *)0x0);
  pcVar9 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
             ,L'~',"ggghhhjjjrrrttt.o","\"ggghhhjjjrrrttt.o\"",pcVar9,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  lVar8 = archive_entry_size(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'\x7f',7,"7",lVar8,"archive_entry_size(ae)",(void *)0x0);
  lVar7 = archive_read_data(paVar3,buff2,0xb);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'\x80',7,"7",lVar7,"archive_read_data(a, buff2, 11)",paVar3);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'\x81',buff2,"buff2","7777777","\"7777777\"",7,"7",(void *)0x0);
  iVar1 = archive_read_next_header(paVar3,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'\x83',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  pcVar9 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
             ,L'\x84',"iiijjjdddsssppp.o","\"iiijjjdddsssppp.o\"",pcVar9,
             "archive_entry_pathname(ae)",(void *)0x0,L'\0');
  lVar8 = archive_entry_size(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'\x85',8,"8",lVar8,"archive_entry_size(ae)",(void *)0x0);
  lVar7 = archive_read_data(paVar3,buff2,0x11);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'\x86',8,"8",lVar7,"archive_read_data(a, buff2, 17)",paVar3);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'\x87',buff2,"buff2","88877766","\"88877766\"",8,"8",(void *)0x0);
  iVar1 = archive_read_close(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'\x89',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar3);
  iVar1 = archive_read_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'\x8a',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  memset(buff,0,0x1000);
  paVar3 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                   ,L'\x90',(uint)(paVar3 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_ar_bsd(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'\x91',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_ar_bsd(a)",
                      paVar3);
  iVar1 = archive_write_open_memory(paVar3,buff,0x1000,&local_40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'\x92',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, sizeof(buff), &used)",paVar3);
  local_38 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                   ,L'\x95',(uint)(local_38 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(local_38,"ttttyyyyuuuuiiii.o");
  archive_entry_set_filetype(local_38,0x8000);
  archive_entry_set_size(local_38,5);
  iVar1 = archive_write_header(paVar3,local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'\x99',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar3);
  lVar8 = archive_entry_size(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'\x9a',5,"5",lVar8,"archive_entry_size(ae)",(void *)0x0);
  lVar7 = archive_write_data(paVar3,"12345",7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'\x9b',5,"5",lVar7,"archive_write_data(a, \"12345\", 7)",paVar3);
  archive_entry_free(local_38);
  local_38 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                   ,L'\x9f',(uint)(local_38 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(local_38,"ttyy.o");
  archive_entry_set_filetype(local_38,0x8000);
  archive_entry_set_size(local_38,6);
  iVar1 = archive_write_header(paVar3,local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'£',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar3);
  lVar7 = archive_write_data(paVar3,"555555",7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'¤',6,"6",lVar7,"archive_write_data(a, \"555555\", 7)",paVar3);
  archive_entry_free(local_38);
  iVar1 = archive_write_close(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'¦',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar3);
  iVar1 = archive_write_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'§',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  paVar3 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                   ,L'ª',(uint)(paVar3 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'«',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar3)
  ;
  iVar1 = archive_read_support_filter_all(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'¬',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar3)
  ;
  iVar1 = archive_read_open_memory(paVar3,buff,local_40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'­',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_memory(a, buff, used)",
                      paVar3);
  iVar1 = archive_read_next_header(paVar3,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'¯',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  pcVar9 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
             ,L'°',"ttttyyyyuuuuiiii.o","\"ttttyyyyuuuuiiii.o\"",pcVar9,
             "archive_entry_pathname(ae)",(void *)0x0,L'\0');
  lVar8 = archive_entry_size(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'±',5,"5",lVar8,"archive_entry_size(ae)",(void *)0x0);
  lVar7 = archive_read_data(paVar3,buff2,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'²',5,"5",lVar7,"archive_read_data(a, buff2, 10)",paVar3);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'³',buff2,"buff2","12345","\"12345\"",5,"5",(void *)0x0);
  iVar1 = archive_read_next_header(paVar3,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'µ',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  pcVar9 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
             ,L'¶',"ttyy.o","\"ttyy.o\"",pcVar9,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  lVar8 = archive_entry_size(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'·',6,"6",lVar8,"archive_entry_size(ae)",(void *)0x0);
  lVar7 = archive_read_data(paVar3,buff2,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'¸',6,"6",lVar7,"archive_read_data(a, buff2, 10)",paVar3);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'¹',buff2,"buff2","555555","\"555555\"",6,"6",(void *)0x0);
  iVar1 = archive_read_next_header(paVar3,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'¼',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  iVar1 = archive_read_close(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'½',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar3);
  iVar1 = archive_read_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_ar.c"
                      ,L'¾',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_ar)
{
	struct archive_entry *ae;
	struct archive* a;
	size_t used;

	/*
	 * First we try to create a SVR4/GNU format archive.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ar_svr4(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, sizeof(buff), &used));

	/* write the filename table */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "//");
	archive_entry_set_size(ae, strlen(strtab));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	assertA(strlen(strtab) == (size_t)archive_write_data(a, strtab, strlen(strtab)));
	archive_entry_free(ae);

	/* write entries */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 0);
	assert(1 == archive_entry_mtime(ae));
	archive_entry_set_mode(ae, S_IFREG | 0755);
	assert((S_IFREG | 0755) == archive_entry_mode(ae));
	archive_entry_copy_pathname(ae, "abcdefghijklmn.o");
	archive_entry_set_size(ae, 8);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	assertA(8 == archive_write_data(a, "87654321", 15));
	archive_entry_free(ae);

	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "ggghhhjjjrrrttt.o");
	archive_entry_set_filetype(ae, AE_IFREG);
	archive_entry_set_size(ae, 7);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	assertEqualIntA(a, 7, archive_write_data(a, "7777777", 7));
	archive_entry_free(ae);

	/* test full pathname */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "/usr/home/xx/iiijjjdddsssppp.o");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 8);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	assertEqualIntA(a, 8, archive_write_data(a, "88877766", 8));
	archive_entry_free(ae);

	/* trailing "/" should be rejected */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "/usr/home/xx/iiijjj/");
	archive_entry_set_size(ae, 8);
	assertA(0 != archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Non regular file should be rejected */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "gfgh.o");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	archive_entry_set_size(ae, 6);
	assertA(0 != archive_write_header(a, ae));
	archive_entry_free(ae);

	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(archive_filter_bytes(a, -1),
	    archive_filter_bytes(a, 0));
	assertEqualInt(used, archive_filter_bytes(a, 0));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Now, read the data back.
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(0, archive_entry_mtime(ae));
	assertEqualString("//", archive_entry_pathname(ae));
	assertEqualInt(0, archive_entry_size(ae));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualString("abcdefghijklmn.o", archive_entry_pathname(ae));
	assertEqualInt(8, archive_entry_size(ae));
	assertEqualIntA(a, 8, archive_read_data(a, buff2, 10));
	assertEqualMem(buff2, "87654321", 8);

	assertEqualInt(ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("ggghhhjjjrrrttt.o", archive_entry_pathname(ae));
	assertEqualInt(7, archive_entry_size(ae));
	assertEqualIntA(a, 7, archive_read_data(a, buff2, 11));
	assertEqualMem(buff2, "7777777", 7);

	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualString("iiijjjdddsssppp.o", archive_entry_pathname(ae));
	assertEqualInt(8, archive_entry_size(ae));
	assertEqualIntA(a, 8, archive_read_data(a, buff2, 17));
	assertEqualMem(buff2, "88877766", 8);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Then, we try to create a BSD format archive.
	 */
	memset(buff, 0, sizeof(buff));
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ar_bsd(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, sizeof(buff), &used));

	/* write a entry need long name extension */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "ttttyyyyuuuuiiii.o");
	archive_entry_set_filetype(ae, AE_IFREG);
	archive_entry_set_size(ae, 5);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	assertEqualInt(5, archive_entry_size(ae));
	assertEqualIntA(a, 5, archive_write_data(a, "12345", 7));
	archive_entry_free(ae);

	/* write a entry with a short name */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "ttyy.o");
	archive_entry_set_filetype(ae, AE_IFREG);
	archive_entry_set_size(ae, 6);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	assertEqualIntA(a, 6, archive_write_data(a, "555555", 7));
	archive_entry_free(ae);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Now, Read the data back */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used));

	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualString("ttttyyyyuuuuiiii.o", archive_entry_pathname(ae));
	assertEqualInt(5, archive_entry_size(ae));
	assertEqualIntA(a, 5, archive_read_data(a, buff2, 10));
	assertEqualMem(buff2, "12345", 5);

	assertEqualIntA(a, 0, archive_read_next_header(a, &ae));
	assertEqualString("ttyy.o", archive_entry_pathname(ae));
	assertEqualInt(6, archive_entry_size(ae));
	assertEqualIntA(a, 6, archive_read_data(a, buff2, 10));
	assertEqualMem(buff2, "555555", 6);

	/* Test EOF */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}